

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_reduce.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListReduceBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  ulong uVar2;
  undefined8 uVar3;
  bool bVar4;
  reference pvVar5;
  pointer pEVar6;
  BoundLambdaExpression *pBVar7;
  LogicalType *pLVar8;
  ListLambdaBindData *this_00;
  BinderException *pBVar9;
  long lVar10;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> bind_data;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> cast_lambda_expr;
  LogicalType list_child_type;
  LogicalType max_logical_type;
  undefined1 local_d0 [40];
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> local_a8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_a0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_98;
  element_type *local_90;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_88;
  LogicalType local_80;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_68;
  undefined1 local_60 [24];
  LogicalType local_48;
  
  local_68._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  if ((pEVar6->super_BaseExpression).expression_class != BOUND_LAMBDA) {
    pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
    local_d0._0_8_ = (long)local_d0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"Invalid lambda expression!","");
    BinderException::BinderException(pBVar9,(string *)local_d0);
    __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  local_88._M_head_impl =
       (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)local_d0,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_88);
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  uVar3 = local_d0._0_8_;
  local_d0._0_8_ = (Expression *)0x0;
  _Var1._M_head_impl =
       (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
      local_d0._0_8_ != (Expression *)0x0) {
    (**(code **)(*(_func_int **)local_d0._0_8_ + 8))();
  }
  local_d0._0_8_ =
       (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
  if (local_88._M_head_impl != (Expression *)0x0) {
    (*((local_88._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_88._M_head_impl = (Expression *)0x0;
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  pBVar7 = BaseExpression::Cast<duckdb::BoundLambdaExpression>(&pEVar6->super_BaseExpression);
  uVar2 = pBVar7->parameter_count;
  if ((uVar2 & 0xfffffffffffffffe) != 2) {
    pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
    local_d0._0_8_ = (long)local_d0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"list_reduce expects a function with 2 or 3 arguments","");
    BinderException::BinderException(pBVar9,(string *)local_d0);
    __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  LambdaFunctions::ListLambdaPrepareBind
            ((LambdaFunctions *)&local_90,arguments,context,bound_function);
  if (local_90 == (element_type *)0x0) {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    LogicalType::LogicalType((LogicalType *)local_60,&pEVar6->return_type);
    pLVar8 = ListType::GetChildType((LogicalType *)local_60);
    if ((LogicalType *)local_60 != pLVar8) {
      local_60[0] = pLVar8->id_;
      local_60[1] = pLVar8->physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_60 + 8),&pLVar8->type_info_);
    }
    lVar10 = (long)(arguments->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(arguments->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar10 == 0x18) {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,2);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      LogicalType::LogicalType(&local_80,&pEVar6->return_type);
      bVar4 = LogicalType::operator==((LogicalType *)local_60,&local_80);
      if (!bVar4) {
        LogicalType::LogicalType(&local_48);
        bVar4 = LogicalType::TryGetMaxLogicalType
                          (context,(LogicalType *)local_60,&local_80,&local_48);
        if (!bVar4) {
          pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
          local_d0._0_8_ = (long)local_d0 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d0,
                     "The initial value type must be the same as the list child type or a common super type"
                     ,"");
          BinderException::BinderException(pBVar9,(string *)local_d0);
          __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_60[0] = local_48.id_;
        local_60[1] = local_48.physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_60 + 8),&local_48.type_info_);
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,0);
        local_a8.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
        .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        LogicalType::LIST((LogicalType *)local_d0,&local_48);
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)(local_d0 + 0x20),context,&local_a8,
                   (LogicalType *)local_d0,false);
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,0);
        uVar3 = local_d0._32_8_;
        local_d0._32_8_ = (long *)0x0;
        _Var1._M_head_impl =
             (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
        if (_Var1._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
        }
        if ((long *)local_d0._32_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_d0._32_8_ + 8))();
        }
        local_d0._32_8_ = (Expression *)0x0;
        LogicalType::~LogicalType((LogicalType *)local_d0);
        if (local_a8.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
            _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)local_a8.
                                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8
                      ))();
        }
        local_a8.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
        .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
              )0x0;
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,2);
        local_98._M_head_impl =
             (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)local_d0,context,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_98,&local_48,false);
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,2);
        uVar3 = local_d0._0_8_;
        local_d0._0_8_ = (Expression *)0x0;
        _Var1._M_head_impl =
             (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
        if (_Var1._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
        }
        if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
            local_d0._0_8_ != (Expression *)0x0) {
          (**(code **)(*(_func_int **)local_d0._0_8_ + 8))();
        }
        local_d0._0_8_ = (BaseStatistics *)0x0;
        if (local_98._M_head_impl != (Expression *)0x0) {
          (*((local_98._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_98._M_head_impl = (Expression *)0x0;
        LogicalType::~LogicalType(&local_48);
      }
      LogicalType::~LogicalType(&local_80);
    }
    local_a0._M_head_impl =
         (pBVar7->lambda_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar7->lambda_expr).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)&local_80,context,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_a0,(LogicalType *)local_60,false);
    if (local_a0._M_head_impl != (Expression *)0x0) {
      (*((local_a0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_a0._M_head_impl = (Expression *)0x0;
    if ((BaseStatistics *)local_80._0_8_ == (BaseStatistics *)0x0) {
      pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
      local_d0._0_8_ = (long)local_d0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,"Could not cast lambda expression to list child type","");
      BinderException::BinderException(pBVar9,(string *)local_d0);
      __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&local_80);
    pLVar8 = &(bound_function->super_BaseScalarFunction).return_type;
    if (pLVar8 != &pEVar6->return_type) {
      (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar6->return_type).id_;
      (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
           (pEVar6->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                 &(pEVar6->return_type).type_info_);
    }
    this_00 = (ListLambdaBindData *)operator_new(0x30);
    local_d0[0] = local_80.id_;
    local_d0[1] = local_80.physical_type_;
    local_d0._2_6_ = local_80._2_6_;
    local_80._0_8_ =
         (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
          )0x0;
    ListLambdaBindData::ListLambdaBindData
              (this_00,pLVar8,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_d0,uVar2 == 3,lVar10 == 0x18);
    if ((BaseStatistics *)local_d0._0_8_ != (BaseStatistics *)0x0) {
      (*((BaseExpression *)local_d0._0_8_)->_vptr_BaseExpression[1])();
    }
    *(_func_int ***)
     local_68._M_t.
     super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
     super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = (_func_int **)this_00;
    if ((BaseStatistics *)local_80._0_8_ != (BaseStatistics *)0x0) {
      (**(code **)(*(long *)local_80._0_8_ + 8))();
    }
    LogicalType::~LogicalType((LogicalType *)local_60);
  }
  else {
    *(element_type **)
     local_68._M_t.
     super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
     super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = local_90;
    local_90 = (element_type *)0x0;
  }
  if (local_90 != (element_type *)0x0) {
    (*local_90->_vptr_ExtraTypeInfo[1])();
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         local_68._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> ListReduceBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {

	// the list column and the bound lambda expression
	D_ASSERT(arguments.size() == 2 || arguments.size() == 3);
	if (arguments[1]->GetExpressionClass() != ExpressionClass::BOUND_LAMBDA) {
		throw BinderException("Invalid lambda expression!");
	}

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	auto &bound_lambda_expr = arguments[1]->Cast<BoundLambdaExpression>();
	if (bound_lambda_expr.parameter_count < 2 || bound_lambda_expr.parameter_count > 3) {
		throw BinderException("list_reduce expects a function with 2 or 3 arguments");
	}
	auto has_index = bound_lambda_expr.parameter_count == 3;

	unique_ptr<FunctionData> bind_data = LambdaFunctions::ListLambdaPrepareBind(arguments, context, bound_function);
	if (bind_data) {
		return bind_data;
	}

	auto list_child_type = arguments[0]->return_type;
	list_child_type = ListType::GetChildType(list_child_type);

	bool has_initial = arguments.size() == 3;
	if (has_initial) {
		const auto initial_value_type = arguments[2]->return_type;
		// Check if the initial value type is the same as the list child type and if not find the max logical type
		if (list_child_type != initial_value_type) {
			LogicalType max_logical_type;
			const auto has_max_logical_type =
			    LogicalType::TryGetMaxLogicalType(context, list_child_type, initial_value_type, max_logical_type);
			if (!has_max_logical_type) {
				throw BinderException(
				    "The initial value type must be the same as the list child type or a common super type");
			}

			list_child_type = max_logical_type;
			arguments[0] = BoundCastExpression::AddCastToType(context, std::move(arguments[0]),
			                                                  LogicalType::LIST(max_logical_type));
			arguments[2] = BoundCastExpression::AddCastToType(context, std::move(arguments[2]), max_logical_type);
		}
	}

	auto cast_lambda_expr =
	    BoundCastExpression::AddCastToType(context, std::move(bound_lambda_expr.lambda_expr), list_child_type);
	if (!cast_lambda_expr) {
		throw BinderException("Could not cast lambda expression to list child type");
	}
	bound_function.return_type = cast_lambda_expr->return_type;
	return make_uniq<ListLambdaBindData>(bound_function.return_type, std::move(cast_lambda_expr), has_index,
	                                     has_initial);
}